

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O2

bool __thiscall SQCompilation::NodeEqualChecker::check(NodeEqualChecker *this,Node *lhs,Node *rhs)

{
  bool bVar1;
  
  bVar1 = true;
  if (lhs != rhs) {
    if ((rhs != (Node *)0x0 && lhs != (Node *)0x0) && (lhs->_op == rhs->_op)) {
      switch(lhs->_op) {
      case TO_BLOCK:
        bVar1 = cmpBlock(this,(Block *)lhs,(Block *)rhs);
        return bVar1;
      case TO_IF:
        bVar1 = cmpIf(this,(IfStatement *)lhs,(IfStatement *)rhs);
        return bVar1;
      case TO_WHILE:
        bVar1 = cmpWhile(this,(WhileStatement *)lhs,(WhileStatement *)rhs);
        return bVar1;
      case TO_DOWHILE:
        bVar1 = cmpDoWhile(this,(DoWhileStatement *)lhs,(DoWhileStatement *)rhs);
        return bVar1;
      case TO_FOR:
        bVar1 = cmpFor(this,(ForStatement *)lhs,(ForStatement *)rhs);
        return bVar1;
      case TO_FOREACH:
        bVar1 = cmpForeach(this,(ForeachStatement *)lhs,(ForeachStatement *)rhs);
        return bVar1;
      case TO_SWITCH:
        bVar1 = cmpSwitch(this,(SwitchStatement *)lhs,(SwitchStatement *)rhs);
        return bVar1;
      case TO_RETURN:
        bVar1 = cmpReturn(this,(ReturnStatement *)lhs,(ReturnStatement *)rhs);
        return bVar1;
      case TO_YIELD:
      case TO_THROW:
        bVar1 = cmpTerminate(this,(TerminateStatement *)lhs,(TerminateStatement *)rhs);
        return bVar1;
      case TO_TRY:
        bVar1 = cmpTry(this,(TryStatement *)lhs,(TryStatement *)rhs);
        return bVar1;
      case TO_BREAK:
      case TO_CONTINUE:
      case TO_EMPTY:
      case TO_BASE:
      case TO_ROOT_TABLE_ACCESS:
        goto switchD_0014c128_caseD_b;
      case TO_EXPR_STMT:
        bVar1 = cmpExprStmt(this,(ExprStatement *)lhs,(ExprStatement *)rhs);
        return bVar1;
      case TO_ID:
        bVar1 = cmpId(this,(Id *)lhs,(Id *)rhs);
        return bVar1;
      case TO_COMMA:
        bVar1 = cmpComma(this,(CommaExpr *)lhs,(CommaExpr *)rhs);
        return bVar1;
      case TO_NULLC:
      case TO_ASSIGN:
      case TO_OROR:
      case TO_ANDAND:
      case TO_OR:
      case TO_XOR:
      case TO_AND:
      case TO_NE:
      case TO_EQ:
      case TO_3CMP:
      case TO_GE:
      case TO_GT:
      case TO_LE:
      case TO_LT:
      case TO_IN:
      case TO_INSTANCEOF:
      case TO_USHR:
      case TO_SHR:
      case TO_SHL:
      case TO_MUL:
      case TO_DIV:
      case TO_MOD:
      case TO_ADD:
      case TO_SUB:
      case TO_NEWSLOT:
      case TO_PLUSEQ:
      case TO_MINUSEQ:
      case TO_MULEQ:
      case TO_DIVEQ:
      case TO_MODEQ:
        bVar1 = cmpBinary(this,(BinExpr *)lhs,(BinExpr *)rhs);
        return bVar1;
      case TO_NOT:
      case TO_BNOT:
      case TO_NEG:
      case TO_TYPEOF:
      case TO_RESUME:
      case TO_CLONE:
      case TO_PAREN:
      case TO_DELETE:
        bVar1 = cmpUnary(this,(UnExpr *)lhs,(UnExpr *)rhs);
        return bVar1;
      case TO_LITERAL:
        bVar1 = cmpLiterals(this,(LiteralExpr *)lhs,(LiteralExpr *)rhs);
        return bVar1;
      case TO_INC:
        bVar1 = cmpIncExpr(this,(IncExpr *)lhs,(IncExpr *)rhs);
        return bVar1;
      case TO_DECL_EXPR:
        bVar1 = cmpDeclExpr(this,(DeclExpr *)lhs,(DeclExpr *)rhs);
        return bVar1;
      case TO_ARRAYEXPR:
        bVar1 = cmpArrayExpr(this,(ArrayExpr *)lhs,(ArrayExpr *)rhs);
        return bVar1;
      case TO_GETFIELD:
        bVar1 = cmpGetField(this,(GetFieldExpr *)lhs,(GetFieldExpr *)rhs);
        return bVar1;
      case TO_GETSLOT:
        bVar1 = cmpGetSlot(this,(GetSlotExpr *)lhs,(GetSlotExpr *)rhs);
        return bVar1;
      case TO_CALL:
        bVar1 = cmpCallExpr(this,(CallExpr *)lhs,(CallExpr *)rhs);
        return bVar1;
      case TO_TERNARY:
        bVar1 = cmpTernary(this,(TerExpr *)lhs,(TerExpr *)rhs);
        return bVar1;
      case TO_VAR:
        bVar1 = cmpVarDecl(this,(VarDecl *)lhs,(VarDecl *)rhs);
        return bVar1;
      case TO_PARAM:
        bVar1 = cmpValueDecl(this,(ValueDecl *)lhs,(ValueDecl *)rhs);
        return bVar1;
      case TO_CONST:
        bVar1 = cmpConst(this,(ConstDecl *)lhs,(ConstDecl *)rhs);
        return bVar1;
      case TO_DECL_GROUP:
        bVar1 = cmpDeclGroup(this,(DeclGroup *)lhs,(DeclGroup *)rhs);
        return bVar1;
      case TO_DESTRUCTURE:
        bVar1 = cmpDestructDecl(this,(DestructuringDecl *)lhs,(DestructuringDecl *)rhs);
        return bVar1;
      case TO_FUNCTION:
      case TO_CONSTRUCTOR:
        bVar1 = cmpFunction(this,(FunctionDecl *)lhs,(FunctionDecl *)rhs);
        return bVar1;
      case TO_CLASS:
        bVar1 = cmpClass(this,(ClassDecl *)lhs,(ClassDecl *)rhs);
        return bVar1;
      case TO_ENUM:
        bVar1 = cmpEnumDecl(this,(EnumDecl *)lhs,(EnumDecl *)rhs);
        return bVar1;
      case TO_TABLE:
        bVar1 = cmpTable(this,(TableDecl *)lhs,(TableDecl *)rhs);
        return bVar1;
      }
    }
    bVar1 = false;
  }
switchD_0014c128_caseD_b:
  return bVar1;
}

Assistant:

bool check(const Node *lhs, const Node *rhs) const {

    if (lhs == rhs)
      return true;

    if (!lhs || !rhs)
      return false;

    if (lhs->op() != rhs->op())
      return false;

    switch (lhs->op())
    {
    case TO_BLOCK:      return cmpBlock((const Block *)lhs, (const Block *)rhs);
    case TO_IF:         return cmpIf((const IfStatement *)lhs, (const IfStatement *)rhs);
    case TO_WHILE:      return cmpWhile((const WhileStatement *)lhs, (const WhileStatement *)rhs);
    case TO_DOWHILE:    return cmpDoWhile((const DoWhileStatement *)lhs, (const DoWhileStatement *)rhs);
    case TO_FOR:        return cmpFor((const ForStatement *)lhs, (const ForStatement *)rhs);
    case TO_FOREACH:    return cmpForeach((const ForeachStatement *)lhs, (const ForeachStatement *)rhs);
    case TO_SWITCH:     return cmpSwitch((const SwitchStatement *)lhs, (const SwitchStatement *)rhs);
    case TO_RETURN:
      return cmpReturn((const ReturnStatement *)lhs, (const ReturnStatement *)rhs);
    case TO_YIELD:
    case TO_THROW:
      return cmpTerminate((const TerminateStatement *)lhs, (const TerminateStatement *)rhs);
    case TO_TRY:
      return cmpTry((const TryStatement *)lhs, (const TryStatement *)rhs);
    case TO_BREAK:
    case TO_CONTINUE:
    case TO_EMPTY:
    case TO_BASE:
    case TO_ROOT_TABLE_ACCESS:
      return true;
    case TO_EXPR_STMT:
      return cmpExprStmt((const ExprStatement *)lhs, (const ExprStatement *)rhs);

      //case TO_STATEMENT_MARK:
    case TO_ID:         return cmpId((const Id *)lhs, (const Id *)rhs);
    case TO_COMMA:      return cmpComma((const CommaExpr *)lhs, (const CommaExpr *)rhs);
    case TO_NULLC:
    case TO_ASSIGN:
    case TO_OROR:
    case TO_ANDAND:
    case TO_OR:
    case TO_XOR:
    case TO_AND:
    case TO_NE:
    case TO_EQ:
    case TO_3CMP:
    case TO_GE:
    case TO_GT:
    case TO_LE:
    case TO_LT:
    case TO_IN:
    case TO_INSTANCEOF:
    case TO_USHR:
    case TO_SHR:
    case TO_SHL:
    case TO_MUL:
    case TO_DIV:
    case TO_MOD:
    case TO_ADD:
    case TO_SUB:
    case TO_NEWSLOT:
    case TO_PLUSEQ:
    case TO_MINUSEQ:
    case TO_MULEQ:
    case TO_DIVEQ:
    case TO_MODEQ:
      return cmpBinary((const BinExpr *)lhs, (const BinExpr *)rhs);
    case TO_NOT:
    case TO_BNOT:
    case TO_NEG:
    case TO_TYPEOF:
    case TO_RESUME:
    case TO_CLONE:
    case TO_PAREN:
    case TO_DELETE:
      return cmpUnary((const UnExpr *)lhs, (const UnExpr *)rhs);
    case TO_LITERAL:
      return cmpLiterals((const LiteralExpr *)lhs, (const LiteralExpr *)rhs);
    case TO_INC:
      return cmpIncExpr((const IncExpr *)lhs, (const IncExpr *)rhs);
    case TO_DECL_EXPR:
      return cmpDeclExpr((const DeclExpr *)lhs, (const DeclExpr *)rhs);
    case TO_ARRAYEXPR:
      return cmpArrayExpr((const ArrayExpr *)lhs, (const ArrayExpr *)rhs);
    case TO_GETFIELD:
      return cmpGetField((const GetFieldExpr *)lhs, (const GetFieldExpr *)rhs);
    case TO_GETSLOT:
      return cmpGetSlot((const GetSlotExpr *)lhs, (const GetSlotExpr *)rhs);
    case TO_CALL:
      return cmpCallExpr((const CallExpr *)lhs, (const CallExpr *)rhs);
    case TO_TERNARY:
      return cmpTernary((const TerExpr *)lhs, (const TerExpr *)rhs);
      //case TO_EXPR_MARK:
    case TO_VAR:
      return cmpVarDecl((const VarDecl *)lhs, (const VarDecl *)rhs);
    case TO_PARAM:
      return cmpValueDecl((const ValueDecl *)lhs, (const ValueDecl *)rhs);
    case TO_CONST:
      return cmpConst((const ConstDecl *)lhs, (const ConstDecl *)rhs);
    case TO_DECL_GROUP:
      return cmpDeclGroup((const DeclGroup *)lhs, (const DeclGroup *)rhs);
    case TO_DESTRUCTURE:
      return cmpDestructDecl((const DestructuringDecl *)lhs, (const DestructuringDecl *)rhs);
    case TO_FUNCTION:
    case TO_CONSTRUCTOR:
      return cmpFunction((const FunctionDecl *)lhs, (const FunctionDecl *)rhs);
    case TO_CLASS:
      return cmpClass((const ClassDecl *)lhs, (const ClassDecl *)rhs);
    case TO_ENUM:
      return cmpEnumDecl((const EnumDecl *)lhs, (const EnumDecl *)rhs);
    case TO_TABLE:
      return cmpTable((const TableDecl *)lhs, (const TableDecl *)rhs);
    case TO_SETFIELD:
    case TO_SETSLOT:
    default:
      assert(0);
      return false;
    }
  }